

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O1

void __thiscall
soplex::DSVectorBase<double>::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
          (DSVectorBase<double> *this,
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *old)

{
  int n;
  
  (this->super_SVectorBase<double>).m_elem = (Nonzero<double> *)0x0;
  (this->super_SVectorBase<double>).memsize = 0;
  (this->super_SVectorBase<double>).memused = 0;
  this->_vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  this->theelem = (Nonzero<double> *)0x0;
  n = (old->
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).memused;
  spx_alloc<soplex::Nonzero<double>*>(&this->theelem,n);
  (this->super_SVectorBase<double>).m_elem = this->theelem;
  (this->super_SVectorBase<double>).memused = 0;
  (this->super_SVectorBase<double>).memsize = n;
  SVectorBase<double>::operator=
            (&this->super_SVectorBase<double>,
             &old->
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            );
  return;
}

Assistant:

DSVectorBase(const DSVectorBase<S>& old)
      : SVectorBase<R>()
      , theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }